

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolutionNeighbourhood.cpp
# Opt level: O2

void __thiscall SolutionNeighbourhood::undoLastMove(SolutionNeighbourhood *this)

{
  Turn *pTVar1;
  Solution *pSVar2;
  pointer ppTVar3;
  pointer ppTVar4;
  __type _Var5;
  int iVar6;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar7;
  Position *pPVar8;
  ShiftType *pSVar9;
  string *psVar10;
  string *psVar11;
  NurseSolution *pNVar12;
  NurseSolution *ns2;
  vector<Turn_*,_std::allocator<Turn_*>_> *__range2;
  Turn *unaff_RBP;
  pointer ppTVar13;
  pointer ppTVar14;
  Move *pMVar15;
  Turn *unaff_R15;
  vector<Turn_*,_std::allocator<Turn_*>_> day1;
  vector<Turn_*,_std::allocator<Turn_*>_> day2;
  
  if (this->lastMove == (Move *)0x0) {
    return;
  }
  day1.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  day1.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  day1.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  day2.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  day2.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  day2.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar6 = Move::getMoveType(this->lastMove);
  if (iVar6 == 0) {
    pvVar7 = Solution::getTurns(this->solution);
    pPVar8 = Move::getLastPosition(this->lastMove);
    iVar6 = Position::getDay(pPVar8);
    std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
              (&day1,(pvVar7->
                     super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + iVar6);
    ppTVar3 = day1.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppTVar14 = day1.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppTVar14 != ppTVar3; ppTVar14 = ppTVar14 + 1)
    {
      pTVar1 = *ppTVar14;
      pSVar9 = Turn::getShiftType(pTVar1);
      psVar10 = ShiftType::getId_abi_cxx11_(pSVar9);
      pPVar8 = Move::getLastPosition(this->lastMove);
      pSVar9 = Position::getShiftType(pPVar8);
      psVar11 = ShiftType::getId_abi_cxx11_(pSVar9);
      _Var5 = std::operator==(psVar10,psVar11);
      if (_Var5) {
        psVar10 = Turn::getSkill_abi_cxx11_(pTVar1);
        pPVar8 = Move::getLastPosition(this->lastMove);
        psVar11 = Position::getSkill_abi_cxx11_(pPVar8);
        _Var5 = std::operator==(psVar10,psVar11);
        if (_Var5) {
          pSVar2 = this->solution;
          pNVar12 = Move::getMovedNurse(this->lastMove);
          Solution::removeNurseFromTurn(pSVar2,pNVar12,pTVar1);
          pMVar15 = this->lastMove;
          if (pMVar15 != (Move *)0x0) goto LAB_001133b0;
          goto LAB_00113495;
        }
      }
    }
LAB_001133a3:
    pMVar15 = this->lastMove;
    if (pMVar15 != (Move *)0x0) {
LAB_001133b0:
      Move::~Move(pMVar15);
      goto LAB_00113495;
    }
  }
  else {
    if (iVar6 == 1) {
      pvVar7 = Solution::getTurns(this->solution);
      pPVar8 = Move::getInitialPosition(this->lastMove);
      iVar6 = Position::getDay(pPVar8);
      std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
                (&day1,(pvVar7->
                       super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + iVar6);
      ppTVar3 = day1.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppTVar14 = day1.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppTVar14 != ppTVar3; ppTVar14 = ppTVar14 + 1
          ) {
        pTVar1 = *ppTVar14;
        pSVar9 = Turn::getShiftType(pTVar1);
        psVar10 = ShiftType::getId_abi_cxx11_(pSVar9);
        pPVar8 = Move::getInitialPosition(this->lastMove);
        pSVar9 = Position::getShiftType(pPVar8);
        psVar11 = ShiftType::getId_abi_cxx11_(pSVar9);
        _Var5 = std::operator==(psVar10,psVar11);
        if (_Var5) {
          psVar10 = Turn::getSkill_abi_cxx11_(pTVar1);
          pPVar8 = Move::getInitialPosition(this->lastMove);
          psVar11 = Position::getSkill_abi_cxx11_(pPVar8);
          _Var5 = std::operator==(psVar10,psVar11);
          if (_Var5) {
            pNVar12 = Move::getMovedNurse(this->lastMove);
            NurseSolution::addTurn(pNVar12,pTVar1);
            goto LAB_001134a5;
          }
        }
      }
      goto LAB_001133a3;
    }
    if (iVar6 != 2) goto LAB_001133a3;
    pvVar7 = Solution::getTurns(this->solution);
    pPVar8 = Move::getInitialPosition(this->lastMove);
    iVar6 = Position::getDay(pPVar8);
    std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
              (&day1,(pvVar7->
                     super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + iVar6);
    pvVar7 = Solution::getTurns(this->solution);
    pPVar8 = Move::getLastPosition(this->lastMove);
    iVar6 = Position::getDay(pPVar8);
    std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
              (&day2,(pvVar7->
                     super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + iVar6);
    ppTVar3 = day1.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppTVar14 = day1.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppTVar4 = day2.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                  super__Vector_impl_data._M_finish,
        ppTVar13 = day2.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                   super__Vector_impl_data._M_start, ppTVar14 != ppTVar3; ppTVar14 = ppTVar14 + 1) {
      unaff_R15 = *ppTVar14;
      pSVar9 = Turn::getShiftType(unaff_R15);
      psVar10 = ShiftType::getId_abi_cxx11_(pSVar9);
      pPVar8 = Move::getInitialPosition(this->lastMove);
      pSVar9 = Position::getShiftType(pPVar8);
      psVar11 = ShiftType::getId_abi_cxx11_(pSVar9);
      _Var5 = std::operator==(psVar10,psVar11);
      if (_Var5) {
        psVar10 = Turn::getSkill_abi_cxx11_(unaff_R15);
        pPVar8 = Move::getInitialPosition(this->lastMove);
        psVar11 = Position::getSkill_abi_cxx11_(pPVar8);
        _Var5 = std::operator==(psVar10,psVar11);
        if (_Var5) {
          unaff_RBP = unaff_R15;
        }
      }
    }
    for (; ppTVar13 != ppTVar4; ppTVar13 = ppTVar13 + 1) {
      pTVar1 = *ppTVar13;
      pSVar9 = Turn::getShiftType(pTVar1);
      psVar10 = ShiftType::getId_abi_cxx11_(pSVar9);
      pPVar8 = Move::getLastPosition(this->lastMove);
      pSVar9 = Position::getShiftType(pPVar8);
      psVar11 = ShiftType::getId_abi_cxx11_(pSVar9);
      _Var5 = std::operator==(psVar10,psVar11);
      if (_Var5) {
        psVar10 = Turn::getSkill_abi_cxx11_(pTVar1);
        pPVar8 = Move::getLastPosition(this->lastMove);
        psVar11 = Position::getSkill_abi_cxx11_(pPVar8);
        _Var5 = std::operator==(psVar10,psVar11);
        if (_Var5) {
          unaff_R15 = pTVar1;
        }
      }
    }
    pSVar2 = this->solution;
    pNVar12 = Move::getMovedNurse(this->lastMove);
    ns2 = Move::getTradedNurse(this->lastMove);
    Solution::atomicSwitchNurseTurns(pSVar2,pNVar12,unaff_R15,ns2,unaff_RBP);
    pMVar15 = this->lastMove;
    if (pMVar15 != (Move *)0x0) {
      Move::~Move(pMVar15);
    }
    operator_delete(pMVar15,0x70);
    this->lastMove = (Move *)0x0;
  }
  pMVar15 = (Move *)0x0;
LAB_00113495:
  operator_delete(pMVar15,0x70);
  this->lastMove = (Move *)0x0;
LAB_001134a5:
  std::_Vector_base<Turn_*,_std::allocator<Turn_*>_>::~_Vector_base
            (&day2.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>);
  std::_Vector_base<Turn_*,_std::allocator<Turn_*>_>::~_Vector_base
            (&day1.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>);
  return;
}

Assistant:

void SolutionNeighbourhood::undoLastMove(){
    if(lastMove == nullptr)
        return;
    vector<Turn*> day1 , day2;
    switch (lastMove->getMoveType())
    {
        case 0:
            //insert so we have to remove
            day1 = solution->getTurns()[lastMove->getLastPosition().getDay()];
            for(Turn* turn : day1)
            {
                if(turn->getShiftType()->getId() == lastMove->getLastPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getLastPosition().getSkill()) {
                    solution->removeNurseFromTurn(lastMove->getMovedNurse(),turn);
                    delete lastMove;
                    lastMove = nullptr;
                    return;
                }
            }
            break;
        case 1:
            //remove so we have to insert
            day1 = solution->getTurns()[lastMove->getInitialPosition().getDay()];
            for(Turn* turn : day1)
            {
                if(turn->getShiftType()->getId() == lastMove->getInitialPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getInitialPosition().getSkill()){
                    lastMove->getMovedNurse()->addTurn(turn);
                return;
                }
            }
            break;
        case 2:
            //trade so we have to do the inverse, so 2 to 1, and 1 to 2
            day1 = solution->getTurns()[lastMove->getInitialPosition().getDay()];
            day2 = solution->getTurns()[lastMove->getLastPosition().getDay()];

            Turn* initialTurn;
            Turn* lastTurn;

            for(Turn* turn : day1)
            {
                if(turn->getShiftType()->getId() == lastMove->getInitialPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getInitialPosition().getSkill())
                    initialTurn = turn;
            }
            for(Turn* turn : day2)
            {
                if(turn->getShiftType()->getId() == lastMove->getLastPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getLastPosition().getSkill())
                    lastTurn = turn;
            }

            //atomicSwitchNurseTurns, invert what lastMove did
            //NS1 / LastPosition / NS2 / InitialPosition
            solution->atomicSwitchNurseTurns(lastMove->getMovedNurse(),lastTurn,lastMove->getTradedNurse(),initialTurn);
            //if(!solution->atomicSwitchNurseTurns(lastMove->getMovedNurse(),lastTurn,lastMove->getTradedNurse(),initialTurn))
                //cout << "ERRO" << endl;
            delete lastMove;
            lastMove = nullptr;
            break;
    }

    delete lastMove;
    lastMove = nullptr;
}